

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cms_test.cc
# Opt level: O1

int main(void)

{
  pointer pbVar1;
  pointer pcVar2;
  CmsQueryListMetricRequestType *this;
  HttpTestListener *pHVar3;
  undefined8 extraout_RAX;
  CmsBatchCreateMetricsRequestType req;
  CmsBatchCreateMetricsResponseType resp;
  string local_2b8;
  long *local_298;
  undefined8 local_290;
  long local_288;
  undefined1 local_280;
  undefined1 local_27f;
  long *local_278;
  undefined8 local_270;
  long local_268;
  undefined1 local_260;
  undefined7 *local_258;
  undefined8 local_250;
  undefined7 local_248;
  undefined4 uStack_241;
  undefined1 local_23d;
  undefined1 local_238 [32];
  _Alloc_hider local_218;
  undefined1 local_210 [24];
  _Alloc_hider local_1f8;
  undefined1 local_1f0 [24];
  _Alloc_hider local_1d8;
  undefined1 local_1d0 [24];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  string local_198;
  undefined1 local_178 [32];
  _Alloc_hider local_158;
  undefined1 local_150 [24];
  _Alloc_hider local_138;
  undefined1 local_130 [24];
  _Alloc_hider local_118;
  undefined1 local_110 [24];
  _Alloc_hider local_f8;
  undefined1 local_f0 [24];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  pbVar1 = (pointer)(local_238 + 0x10);
  local_238._8_8_ = (pointer)0x0;
  local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
  local_218._M_p = local_210 + 8;
  local_210._0_8_ = 0;
  local_210[8] = '\0';
  local_1f8._M_p = local_1f0 + 8;
  local_1f0._0_8_ = 0;
  local_1f0[8] = '\0';
  local_178._0_8_ = local_178 + 0x10;
  local_178._8_8_ = (pointer)0x0;
  local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
  local_158._M_p = local_150 + 8;
  local_150._0_8_ = 0;
  local_150[8] = '\0';
  local_138._M_p = local_130 + 8;
  local_130._0_8_ = 0;
  local_130[8] = '\0';
  pcVar2 = local_110 + 8;
  local_110._0_8_ = 0;
  local_110[8] = '\0';
  local_f8._M_p = local_f0 + 8;
  local_f0._0_8_ = 0;
  local_f0[8] = '\0';
  local_248 = 0x676e61682d6e63;
  uStack_241 = 0x756f687a;
  local_250 = 0xb;
  local_23d = 0;
  local_268 = 0x64697070615f796d;
  local_270 = 8;
  local_260 = 0;
  local_288 = 0x65726365735f796d;
  local_280 = 0x74;
  local_290 = 9;
  local_27f = 0;
  local_298 = &local_288;
  local_278 = &local_268;
  local_258 = &local_248;
  local_238._0_8_ = pbVar1;
  local_118._M_p = pcVar2;
  this = (CmsQueryListMetricRequestType *)
         aliyun::Cms::CreateCmsClient(&local_258,&local_278,&local_298);
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
  }
  if (this == (CmsQueryListMetricRequestType *)0x0) {
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0010fbb5;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0010fce9;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_d8._M_p = (pointer)&local_c8;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0010fe09;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsBatchQueryMetricRequestType::~CmsBatchQueryMetricRequestType
              ((CmsBatchQueryMetricRequestType *)local_178);
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    pbVar1 = (pointer)(local_238 + 0x10);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0010ffa1;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001100ad;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001101e1;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00110301;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0011040d;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00110541;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0011064d;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0011076d;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0011088d;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001109ad;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00110ab9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
    }
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_78._M_p = (pointer)&local_68;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00110c29;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsDescribeMetricDatumRequestType::~CmsDescribeMetricDatumRequestType
              ((CmsDescribeMetricDatumRequestType *)local_178);
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00110dd5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsDescribeMetricListRequestType::~CmsDescribeMetricListRequestType
              ((CmsDescribeMetricListRequestType *)local_178);
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    pbVar1 = (pointer)(local_238 + 0x10);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00110f6d;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00111079;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001111ad;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001112cd;
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsGetMetricStatisticsRequestType::~CmsGetMetricStatisticsRequestType
              ((CmsGetMetricStatisticsRequestType *)local_178);
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00111465;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._16_8_ = 0;
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (pointer)0x0;
    local_158._M_p = (pointer)0x0;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._16_8_ = local_130;
    local_138._M_p = (pointer)0x0;
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    local_130._16_8_ = local_110;
    local_118._M_p = (pointer)0x0;
    local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
    local_110._16_8_ = local_f0;
    local_f8._M_p = (pointer)0x0;
    local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = (pointer)(local_238 + 0x10);
    local_178._24_8_ = local_150;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00111585;
    if ((undefined1 *)local_110._16_8_ != local_f0) {
      operator_delete((void *)local_110._16_8_,local_f0._0_8_ + 1);
    }
    if ((undefined1 *)local_130._16_8_ != local_110) {
      operator_delete((void *)local_130._16_8_,local_110._0_8_ + 1);
    }
    if ((undefined1 *)local_150._16_8_ != local_130) {
      operator_delete((void *)local_150._16_8_,local_130._0_8_ + 1);
    }
    if ((undefined1 *)local_178._24_8_ != local_150) {
      operator_delete((void *)local_178._24_8_,local_150._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001116a5;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001117c5;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001118d1;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_178._16_8_ = 0;
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (pointer)0x0;
    local_158._M_p = (pointer)0x0;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._16_8_ = local_130;
    local_138._M_p = (pointer)0x0;
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    local_130._16_8_ = local_110;
    local_118._M_p = (pointer)0x0;
    local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
    local_110._16_8_ = local_f0;
    local_f8._M_p = (pointer)0x0;
    local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_178._24_8_ = local_150;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001119f1;
    if ((undefined1 *)local_110._16_8_ != local_f0) {
      operator_delete((void *)local_110._16_8_,local_f0._0_8_ + 1);
    }
    if ((undefined1 *)local_130._16_8_ != local_110) {
      operator_delete((void *)local_130._16_8_,local_110._0_8_ + 1);
    }
    if ((undefined1 *)local_150._16_8_ != local_130) {
      operator_delete((void *)local_150._16_8_,local_130._0_8_ + 1);
    }
    if ((undefined1 *)local_178._24_8_ != local_150) {
      operator_delete((void *)local_178._24_8_,local_150._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00111b25;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_238._24_8_ = local_210;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00111c45;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_238._24_8_ = local_210;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00111da1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_1d8._M_p = local_1d0 + 8;
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_178._16_8_ = 0;
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (pointer)0x0;
    local_158._M_p = (pointer)0x0;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._16_8_ = local_130;
    local_138._M_p = (pointer)0x0;
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    local_130._16_8_ = local_110;
    local_118._M_p = (pointer)0x0;
    local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
    local_110._16_8_ = local_f0;
    local_f8._M_p = (pointer)0x0;
    local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_178._24_8_ = local_150;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00111efd;
    if ((undefined1 *)local_110._16_8_ != local_f0) {
      operator_delete((void *)local_110._16_8_,local_f0._0_8_ + 1);
    }
    if ((undefined1 *)local_130._16_8_ != local_110) {
      operator_delete((void *)local_130._16_8_,local_110._0_8_ + 1);
    }
    if ((undefined1 *)local_150._16_8_ != local_130) {
      operator_delete((void *)local_150._16_8_,local_130._0_8_ + 1);
    }
    if ((undefined1 *)local_178._24_8_ != local_150) {
      operator_delete((void *)local_178._24_8_,local_150._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    if (local_1d8._M_p != local_1d0 + 8) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_178._16_8_ = 0;
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (pointer)0x0;
    local_158._M_p = (pointer)0x0;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._16_8_ = local_130;
    local_138._M_p = (pointer)0x0;
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    local_130._16_8_ = local_110;
    local_118._M_p = (pointer)0x0;
    local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
    local_110._16_8_ = local_f0;
    local_f8._M_p = (pointer)0x0;
    local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_178._24_8_ = local_150;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00112045;
    if ((undefined1 *)local_110._16_8_ != local_f0) {
      operator_delete((void *)local_110._16_8_,local_f0._0_8_ + 1);
    }
    if ((undefined1 *)local_130._16_8_ != local_110) {
      operator_delete((void *)local_130._16_8_,local_110._0_8_ + 1);
    }
    if ((undefined1 *)local_150._16_8_ != local_130) {
      operator_delete((void *)local_150._16_8_,local_130._0_8_ + 1);
    }
    if ((undefined1 *)local_178._24_8_ != local_150) {
      operator_delete((void *)local_178._24_8_,local_150._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_1d8._M_p = local_1d0 + 8;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_178._16_8_ = 0;
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (pointer)0x0;
    local_158._M_p = (pointer)0x0;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._16_8_ = local_130;
    local_138._M_p = (pointer)0x0;
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    local_130._16_8_ = local_110;
    local_118._M_p = (pointer)0x0;
    local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
    local_110._16_8_ = local_f0;
    local_f8._M_p = (pointer)0x0;
    local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_178._24_8_ = local_150;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00112179;
    if ((undefined1 *)local_110._16_8_ != local_f0) {
      operator_delete((void *)local_110._16_8_,local_f0._0_8_ + 1);
    }
    if ((undefined1 *)local_130._16_8_ != local_110) {
      operator_delete((void *)local_130._16_8_,local_110._0_8_ + 1);
    }
    if ((undefined1 *)local_150._16_8_ != local_130) {
      operator_delete((void *)local_150._16_8_,local_130._0_8_ + 1);
    }
    if ((undefined1 *)local_178._24_8_ != local_150) {
      operator_delete((void *)local_178._24_8_,local_150._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    pbVar1 = (pointer)(local_238 + 0x10);
    if (local_1d8._M_p != local_1d0 + 8) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001122c1;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001123e1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsQueryIncrementalRequestType::~CmsQueryIncrementalRequestType
              ((CmsQueryIncrementalRequestType *)local_178);
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0011258d;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsQueryListMetricRequestType::~CmsQueryListMetricRequestType
              ((CmsQueryListMetricRequestType *)local_178);
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0011274d;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsQueryMetricRequestType::~CmsQueryMetricRequestType
              ((CmsQueryMetricRequestType *)local_178);
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001128f9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsQueryMetricTopNRequestType::~CmsQueryMetricTopNRequestType
              ((CmsQueryMetricTopNRequestType *)local_178);
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_238._16_8_ = (pointer)0x0;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_218._M_p = (pointer)0x0;
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._16_8_ = local_1f0;
    local_1f8._M_p = (pointer)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_1f0._16_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = &local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._24_8_ = local_210;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00112aa5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._16_8_ != local_1d0) {
      operator_delete((void *)local_1f0._16_8_,local_1d0._0_8_ + 1);
    }
    if ((undefined1 *)local_210._16_8_ != local_1f0) {
      operator_delete((void *)local_210._16_8_,local_1f0._0_8_ + 1);
    }
    if ((undefined1 *)local_238._24_8_ != local_210) {
      operator_delete((void *)local_238._24_8_,local_210._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    aliyun::CmsQueryStatisticsRequestType::~CmsQueryStatisticsRequestType
              ((CmsQueryStatisticsRequestType *)local_178);
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    pbVar1 = (pointer)(local_238 + 0x10);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00112c51;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00112d71;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00112e7d;
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_00112f89;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001130a9;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001131b5;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_1d8._M_p = local_1d0 + 8;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_001132d5;
    if (local_1d8._M_p != local_1d0 + 8) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_1f8._M_p = local_1f0 + 8;
    local_1f0._0_8_ = 0;
    local_1f0[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this != (CmsQueryListMetricRequestType *)0x0) goto LAB_0011341d;
    if (local_118._M_p != pcVar2) {
      operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
    }
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_1f8._M_p != local_1f0 + 8) {
      operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
    }
    if (local_218._M_p != local_210 + 8) {
      operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
    }
    if ((pointer)local_238._0_8_ != pbVar1) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._M_p = local_210 + 8;
    local_210._0_8_ = 0;
    local_210[8] = '\0';
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_110._0_8_ = 0;
    local_110[8] = '\0';
    local_248 = 0x676e61682d6e63;
    uStack_241 = 0x756f687a;
    local_250 = 0xb;
    local_23d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = 0;
    local_288 = 0x65726365735f796d;
    local_280 = 0x74;
    local_290 = 9;
    local_27f = 0;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258 = &local_248;
    local_238._0_8_ = pbVar1;
    local_118._M_p = pcVar2;
    this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
    }
    if (this == (CmsQueryListMetricRequestType *)0x0) {
      if (local_118._M_p != pcVar2) {
        operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
      }
      if (local_138._M_p != local_130 + 8) {
        operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
      }
      if (local_158._M_p != local_150 + 8) {
        operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
      }
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      if (local_218._M_p != local_210 + 8) {
        operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
      }
      if ((pointer)local_238._0_8_ != pbVar1) {
        operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
      }
      local_178._0_8_ = local_178 + 0x10;
      local_248 = 0x676e61682d6e63;
      local_268 = 0x64697070615f796d;
      local_288 = 0x65726365735f796d;
      local_178._8_8_ = (pointer)0x0;
      local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
      local_158._M_p = local_150 + 8;
      local_150._0_8_ = 0;
      local_150[8] = '\0';
      local_138._M_p = local_130 + 8;
      local_130._0_8_ = 0;
      local_130[8] = '\0';
      local_110._0_8_ = 0;
      local_110[8] = '\0';
      local_238._8_8_ = (pointer)0x0;
      local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
      local_218._M_p = local_210 + 8;
      local_210._0_8_ = 0;
      local_210[8] = '\0';
      local_1f8._M_p = local_1f0 + 8;
      local_1f0._0_8_ = 0;
      local_1f0[8] = '\0';
      local_1d8._M_p = local_1d0 + 8;
      local_1d0._0_8_ = 0;
      local_1d0[8] = '\0';
      uStack_241 = 0x756f687a;
      local_250 = 0xb;
      local_23d = 0;
      local_270 = 8;
      local_260 = 0;
      local_280 = 0x74;
      local_290 = 9;
      local_27f = 0;
      local_298 = &local_288;
      local_278 = &local_268;
      local_258 = &local_248;
      local_238._0_8_ = pbVar1;
      local_118._M_p = pcVar2;
      this = (CmsQueryListMetricRequestType *)aliyun::Cms::CreateCmsClient();
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,CONCAT17((undefined1)uStack_241,local_248) + 1);
      }
      if (this == (CmsQueryListMetricRequestType *)0x0) {
        if (local_1d8._M_p != local_1d0 + 8) {
          operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
        }
        if (local_1f8._M_p != local_1f0 + 8) {
          operator_delete(local_1f8._M_p,CONCAT71(local_1f0._9_7_,local_1f0[8]) + 1);
        }
        if (local_218._M_p != local_210 + 8) {
          operator_delete(local_218._M_p,CONCAT71(local_210._9_7_,local_210[8]) + 1);
        }
        if ((pointer)local_238._0_8_ != pbVar1) {
          operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
        }
        if (local_118._M_p != pcVar2) {
          operator_delete(local_118._M_p,CONCAT71(local_110._9_7_,local_110[8]) + 1);
        }
        if (local_138._M_p != local_130 + 8) {
          operator_delete(local_138._M_p,CONCAT71(local_130._9_7_,local_130[8]) + 1);
        }
        if (local_158._M_p != local_150 + 8) {
          operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
        }
        if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
        return 0;
      }
      goto LAB_00113671;
    }
  }
  else {
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    std::__cxx11::string::operator=((string *)&local_1f8,"Sqls");
    aliyun::Cms::BatchCreateMetrics
              ((CmsBatchCreateMetricsRequestType *)this,
               (CmsBatchCreateMetricsResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_1();
LAB_0010fbb5:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"Sqls");
    std::__cxx11::string::operator=((string *)&local_1f8,"IsPublic");
    aliyun::Cms::BatchCreateSqlMetrics
              ((CmsBatchCreateSqlMetricsRequestType *)this,
               (CmsBatchCreateSqlMetricsResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_2();
LAB_0010fce9:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTableName");
    std::__cxx11::string::operator=((string *)&local_218,"Body");
    aliyun::Cms::BatchPutDimTableData
              ((CmsBatchPutDimTableDataRequestType *)this,
               (CmsBatchPutDimTableDataResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_3();
LAB_0010fe09:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"Extend");
    std::__cxx11::string::operator=((string *)&local_98,"Filter");
    aliyun::Cms::BatchQueryMetric
              ((CmsBatchQueryMetricRequestType *)this,(CmsBatchQueryMetricResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_4();
LAB_0010ffa1:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTable");
    aliyun::Cms::CreateDimTable
              ((CmsCreateDimTableRequestType *)this,(CmsCreateDimTableResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_5();
LAB_001100ad:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    std::__cxx11::string::operator=((string *)&local_1f8,"Metrics");
    aliyun::Cms::CreateMetrics
              ((CmsCreateMetricsRequestType *)this,(CmsCreateMetricsResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_6();
LAB_001101e1:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStream");
    aliyun::Cms::CreateMetricStream
              ((CmsCreateMetricStreamRequestType *)this,
               (CmsCreateMetricStreamResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_7();
LAB_00110301:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"Project");
    aliyun::Cms::CreateProject
              ((CmsCreateProjectRequestType *)this,(CmsCreateProjectResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_8();
LAB_0011040d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"Sql");
    std::__cxx11::string::operator=((string *)&local_1f8,"IsPublic");
    aliyun::Cms::CreateSQLMetrics
              ((CmsCreateSQLMetricsRequestType *)this,(CmsCreateSQLMetricsResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_9();
LAB_00110541:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTableName");
    aliyun::Cms::DeleteDimTable
              ((CmsDeleteDimTableRequestType *)this,(CmsDeleteDimTableResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_10();
LAB_0011064d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTableName");
    std::__cxx11::string::operator=((string *)&local_218,"Key");
    aliyun::Cms::DeleteDimTableData
              ((CmsDeleteDimTableDataRequestType *)this,
               (CmsDeleteDimTableDataResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_11();
LAB_0011076d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricName");
    aliyun::Cms::DeleteMetrics
              ((CmsDeleteMetricsRequestType *)this,(CmsDeleteMetricsResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_12();
LAB_0011088d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    aliyun::Cms::DeleteMetricStream
              ((CmsDeleteMetricStreamRequestType *)this,
               (CmsDeleteMetricStreamResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_13();
LAB_001109ad:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    aliyun::Cms::DeleteProject
              ((CmsDeleteProjectRequestType *)this,(CmsDeleteProjectResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_14();
LAB_00110ab9:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    aliyun::Cms::DescribeMetric
              ((CmsDescribeMetricRequestType *)this,(CmsDescribeMetricResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_15();
LAB_00110c29:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"Page");
    std::__cxx11::string::operator=((string *)&local_98,"Length");
    std::__cxx11::string::operator=((string *)&local_78,"Extend");
    aliyun::Cms::DescribeMetricDatum
              ((CmsDescribeMetricDatumRequestType *)this,
               (CmsDescribeMetricDatumResponseType *)local_178,(CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_16();
LAB_00110dd5:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"Page");
    std::__cxx11::string::operator=((string *)&local_98,"Length");
    aliyun::Cms::DescribeMetricList
              ((CmsDescribeMetricListRequestType *)this,
               (CmsDescribeMetricListResponseType *)local_178,(CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_17();
LAB_00110f6d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTableName");
    aliyun::Cms::GetDimTable
              ((CmsGetDimTableRequestType *)this,(CmsGetDimTableResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_18();
LAB_00111079:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    std::__cxx11::string::operator=((string *)&local_1f8,"MetricName");
    aliyun::Cms::GetMetrics
              ((CmsGetMetricsRequestType *)this,(CmsGetMetricsResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_19();
LAB_001111ad:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricName");
    aliyun::Cms::GetMetricsMeta
              ((CmsGetMetricsMetaRequestType *)this,(CmsGetMetricsMetaResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_20();
LAB_001112cd:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"NextToken\": \"NextToken\",  \"Code\": \"Code\",  \"Message\": \"Message\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Namespace_");
    std::__cxx11::string::operator=((string *)&local_158,"MetricName");
    std::__cxx11::string::operator=((string *)&local_138,"StartTime");
    std::__cxx11::string::operator=((string *)&local_118,"EndTime");
    std::__cxx11::string::operator=((string *)&local_f8,"Interval");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"NextToken");
    std::__cxx11::string::operator=((string *)&local_98,"Length");
    aliyun::Cms::GetMetricStatistics
              ((CmsGetMetricStatisticsRequestType *)this,
               (CmsGetMetricStatisticsResponseType *)local_178,(CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_21();
LAB_00111465:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    aliyun::Cms::GetMetricStream
              ((CmsGetMetricStreamRequestType *)this,(CmsGetMetricStreamResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_22();
LAB_00111585:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    aliyun::Cms::GetMetricStreamMeta
              ((CmsGetMetricStreamMetaRequestType *)this,
               (CmsGetMetricStreamMetaResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_23();
LAB_001116a5:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    aliyun::Cms::GetMetricStreamStatus
              ((CmsGetMetricStreamStatusRequestType *)this,
               (CmsGetMetricStreamStatusResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_24();
LAB_001117c5:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    aliyun::Cms::GetProject
              ((CmsGetProjectRequestType *)this,(CmsGetProjectResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_25();
LAB_001118d1:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricName");
    aliyun::Cms::GetSQLMetrics
              ((CmsGetSQLMetricsRequestType *)this,(CmsGetSQLMetricsResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_26();
LAB_001119f1:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTableName");
    std::__cxx11::string::operator=((string *)&local_218,"Page");
    std::__cxx11::string::operator=((string *)&local_1f8,"PageSize");
    aliyun::Cms::ListDimTable
              ((CmsListDimTableRequestType *)this,(CmsListDimTableResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_27();
LAB_00111b25:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTableName");
    std::__cxx11::string::operator=((string *)&local_218,"Key");
    aliyun::Cms::ListDimTableData
              ((CmsListDimTableDataRequestType *)this,(CmsListDimTableDataResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_28();
LAB_00111c45:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_158,"MetricStreamName");
    std::__cxx11::string::operator=((string *)&local_138,"MetricName");
    std::__cxx11::string::operator=((string *)&local_118,"Page");
    std::__cxx11::string::operator=((string *)&local_f8,"PageSize");
    aliyun::Cms::ListMetrics
              ((CmsListMetricsRequestType *)this,(CmsListMetricsResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_29();
LAB_00111da1:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_158,"MetricStreamName");
    std::__cxx11::string::operator=((string *)&local_138,"MetricName");
    std::__cxx11::string::operator=((string *)&local_118,"Page");
    std::__cxx11::string::operator=((string *)&local_f8,"PageSize");
    aliyun::Cms::ListMetricsPlan
              ((CmsListMetricsPlanRequestType *)this,(CmsListMetricsPlanResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_30();
LAB_00111efd:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    std::__cxx11::string::operator=((string *)&local_1f8,"Page");
    std::__cxx11::string::operator=((string *)&local_1d8,"PageSize");
    aliyun::Cms::ListMetricStream
              ((CmsListMetricStreamRequestType *)this,(CmsListMetricStreamResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_31();
LAB_00112045:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectOwner");
    std::__cxx11::string::operator=((string *)&local_218,"Page");
    std::__cxx11::string::operator=((string *)&local_1f8,"PageSize");
    aliyun::Cms::ListProject
              ((CmsListProjectRequestType *)this,(CmsListProjectResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_32();
LAB_00112179:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricName");
    std::__cxx11::string::operator=((string *)&local_1f8,"Page");
    std::__cxx11::string::operator=((string *)&local_1d8,"PageSize");
    aliyun::Cms::ListSQLMetrics
              ((CmsListSQLMetricsRequestType *)this,(CmsListSQLMetricsResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_33();
LAB_001122c1:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTableName");
    std::__cxx11::string::operator=((string *)&local_218,"Body");
    aliyun::Cms::PutDimTableData
              ((CmsPutDimTableDataRequestType *)this,(CmsPutDimTableDataResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_34();
LAB_001123e1:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"TargetPeriod");
    std::__cxx11::string::operator=((string *)&local_98,"Columns");
    std::__cxx11::string::operator=((string *)&local_78,"Extend");
    aliyun::Cms::QueryIncremental
              ((CmsQueryIncrementalRequestType *)this,(CmsQueryIncrementalResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_35();
LAB_0011258d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"Page");
    std::__cxx11::string::operator=((string *)&local_98,"Length");
    std::__cxx11::string::operator=((string *)&local_78,"Extend");
    std::__cxx11::string::operator=((string *)&local_58,"Filter");
    aliyun::Cms::QueryListMetric
              (this,(CmsQueryListMetricResponseType *)local_178,(CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_36();
LAB_0011274d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"Page");
    std::__cxx11::string::operator=((string *)&local_98,"Length");
    std::__cxx11::string::operator=((string *)&local_78,"Extend");
    aliyun::Cms::QueryMetric
              ((CmsQueryMetricRequestType *)this,(CmsQueryMetricResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_37();
LAB_001128f9:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"ValueKey");
    std::__cxx11::string::operator=((string *)&local_98,"Top");
    std::__cxx11::string::operator=((string *)&local_78,"Extend");
    aliyun::Cms::QueryMetricTopN
              ((CmsQueryMetricTopNRequestType *)this,(CmsQueryMetricTopNResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_38();
LAB_00112aa5:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"Project");
    std::__cxx11::string::operator=((string *)&local_158,"Metric");
    std::__cxx11::string::operator=((string *)&local_138,"Period");
    std::__cxx11::string::operator=((string *)&local_118,"StartTime");
    std::__cxx11::string::operator=((string *)&local_f8,"EndTime");
    std::__cxx11::string::operator=((string *)&local_d8,"Dimensions");
    std::__cxx11::string::operator=((string *)&local_b8,"TargetPeriod");
    std::__cxx11::string::operator=((string *)&local_98,"Function");
    std::__cxx11::string::operator=((string *)&local_78,"Extend");
    aliyun::Cms::QueryStatistics
              ((CmsQueryStatisticsRequestType *)this,(CmsQueryStatisticsResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_39();
LAB_00112c51:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    aliyun::Cms::StartMetricStream
              ((CmsStartMetricStreamRequestType *)this,(CmsStartMetricStreamResponseType *)local_238
               ,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_40();
LAB_00112d71:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    aliyun::Cms::StartProject
              ((CmsStartProjectRequestType *)this,(CmsStartProjectResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_41();
LAB_00112e7d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    aliyun::Cms::StatusProject
              ((CmsStatusProjectRequestType *)this,(CmsStatusProjectResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_42();
LAB_00112f89:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    aliyun::Cms::StopMetricStream
              ((CmsStopMetricStreamRequestType *)this,(CmsStopMetricStreamResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_43();
LAB_001130a9:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    aliyun::Cms::StopProject
              ((CmsStopProjectRequestType *)this,(CmsStopProjectResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_44();
LAB_001131b5:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"DimTableName");
    std::__cxx11::string::operator=((string *)&local_218,"DimTable");
    aliyun::Cms::UpdateDimTable
              ((CmsUpdateDimTableRequestType *)this,(CmsUpdateDimTableResponseType *)local_238,
               (CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_45();
LAB_001132d5:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_178,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_158,"MetricStreamName");
    std::__cxx11::string::operator=((string *)&local_138,"MetricName");
    std::__cxx11::string::operator=((string *)&local_118,"Metrics");
    aliyun::Cms::UpdateMetrics
              ((CmsUpdateMetricsRequestType *)this,(CmsUpdateMetricsResponseType *)local_178,
               (CmsErrorInfo *)local_238);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_46();
LAB_0011341d:
    local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_198.field_2._M_local_buf[7] = '.';
    local_198.field_2._8_7_ = 0x34333232313a31;
    local_198._M_string_length = 0xf;
    local_198.field_2._M_local_buf[0xf] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT17(local_198.field_2._M_local_buf[7],
                               local_198.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_238,"ProjectName");
    std::__cxx11::string::operator=((string *)&local_218,"MetricStreamName");
    std::__cxx11::string::operator=((string *)&local_1f8,"MetricStream");
    aliyun::Cms::UpdateMetricStream
              ((CmsUpdateMetricStreamRequestType *)this,
               (CmsUpdateMetricStreamResponseType *)local_238,(CmsErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_47();
  }
  local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_198.field_2._M_local_buf[7] = '.';
  local_198.field_2._8_7_ = 0x34333232313a31;
  local_198._M_string_length = 0xf;
  local_198.field_2._M_local_buf[0xf] = '\0';
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT17(local_198.field_2._M_local_buf[7],
                             local_198.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->metric)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
  }
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
             ,"");
  HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  HttpTestListener::Start(pHVar3);
  std::__cxx11::string::operator=((string *)local_238,"ProjectName");
  std::__cxx11::string::operator=((string *)&local_218,"Project");
  aliyun::Cms::UpdateProject
            ((CmsUpdateProjectRequestType *)this,(CmsUpdateProjectResponseType *)local_238,
             (CmsErrorInfo *)local_178);
  HttpTestListener::WaitComplete(pHVar3);
  main_cold_48();
LAB_00113671:
  local_198.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_198.field_2._M_local_buf[7] = '.';
  local_198.field_2._8_7_ = 0x34333232313a31;
  local_198._M_string_length = 0xf;
  local_198.field_2._M_local_buf[0xf] = '\0';
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  aliyun::Cms::SetProxyHost((Cms *)this,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT17(local_198.field_2._M_local_buf[7],
                             local_198.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->metric)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
  }
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
             ,"");
  HttpTestListener::SetResponseBody(pHVar3,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  HttpTestListener::Start(pHVar3);
  std::__cxx11::string::operator=((string *)local_178,"ProjectName");
  std::__cxx11::string::operator=((string *)&local_158,"MetricName");
  std::__cxx11::string::operator=((string *)&local_138,"Sql");
  std::__cxx11::string::operator=((string *)&local_118,"IsPublic");
  aliyun::Cms::updateSQLMetrics
            ((CmsupdateSQLMetricsRequestType *)this,(CmsupdateSQLMetricsResponseType *)local_178,
             (CmsErrorInfo *)local_238);
  HttpTestListener::WaitComplete(pHVar3);
  main_cold_49();
  aliyun::CmsQueryListMetricResponseType::~CmsQueryListMetricResponseType
            ((CmsQueryListMetricResponseType *)local_238);
  aliyun::CmsQueryListMetricRequestType::~CmsQueryListMetricRequestType
            ((CmsQueryListMetricRequestType *)local_178);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_batch_create_metrics();
  test_batch_create_sql_metrics();
  test_batch_put_dim_table_data();
  test_batch_query_metric();
  test_create_dim_table();
  test_create_metrics();
  test_create_metric_stream();
  test_create_project();
  test_create_sq_lmetrics();
  test_delete_dim_table();
  test_delete_dim_table_data();
  test_delete_metrics();
  test_delete_metric_stream();
  test_delete_project();
  test_describe_metric();
  test_describe_metric_datum();
  test_describe_metric_list();
  test_get_dim_table();
  test_get_metrics();
  test_get_metrics_meta();
  test_get_metric_statistics();
  test_get_metric_stream();
  test_get_metric_stream_meta();
  test_get_metric_stream_status();
  test_get_project();
  test_get_sq_lmetrics();
  test_list_dim_table();
  test_list_dim_table_data();
  test_list_metrics();
  test_list_metrics_plan();
  test_list_metric_stream();
  test_list_project();
  test_list_sq_lmetrics();
  test_put_dim_table_data();
  test_query_incremental();
  test_query_list_metric();
  test_query_metric();
  test_query_metric_top_n();
  test_query_statistics();
  test_start_metric_stream();
  test_start_project();
  test_status_project();
  test_stop_metric_stream();
  test_stop_project();
  test_update_dim_table();
  test_update_metrics();
  test_update_metric_stream();
  test_update_project();
  test_update_sq_lmetrics();
}